

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O3

Pipeline * __thiscall Pipeline::getNext(Pipeline *this,bool allow_null)

{
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (this->next_ != (Pipeline *)0x0 || allow_null) {
    return this->next_;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,&this->identifier,
                 ": Pipeline::getNext() called on pipeline with no next");
  std::logic_error::logic_error(this_00,(string *)&bStack_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pipeline*
Pipeline::getNext(bool allow_null)
{
    if (!next_ && !allow_null) {
        throw std::logic_error(
            this->identifier + ": Pipeline::getNext() called on pipeline with no next");
    }
    return next_;
}